

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

out_of_range * __thiscall
nlohmann::detail::out_of_range::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (out_of_range *__return_storage_ptr__,out_of_range *this,int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  undefined4 in_register_00000014;
  string w;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out_of_range","");
  exception::name(&local_90,&local_70,(int)this);
  local_48 = 0;
  local_40[0] = 0;
  uVar2 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    uVar2 = local_90.field_2._M_allocated_capacity;
  }
  local_50 = local_40;
  if ((local_90._M_string_length < 0x10) && ((ulong)uVar2 < local_90._M_string_length)) {
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_50,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
  }
  else {
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_40);
  }
  local_d0 = &local_c0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar3[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar3;
  }
  local_c8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,*(ulong *)CONCAT44(in_register_00000014,id_));
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  exception::exception(&__return_storage_ptr__->super_exception,(int)this,(char *)local_b0);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_0086b7e0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("out_of_range", id_) + exception::diagnostics(context) + what_arg;
        return {id_, w.c_str()};
    }